

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::SceneLoader::end__axis____common_sidref_or_param_type(SceneLoader *this)

{
  long in_RDI;
  String *in_stack_00000008;
  
  KinematicsBindJointAxis::getAxis(*(KinematicsBindJointAxis **)(in_RDI + 0x68));
  KinematicsSidrefOrParam::setParamValue((KinematicsSidrefOrParam *)this,in_stack_00000008);
  std::__cxx11::string::clear();
  return true;
}

Assistant:

bool SceneLoader::end__axis____common_sidref_or_param_type()
	{
		mCurrentBindJointAxis->getAxis().setParamValue(mCurrentCharacterData);
		mCurrentCharacterData.clear();
		return true;
	}